

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryControllersLoader.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::LibraryControllersLoader::dataJointArray
          (LibraryControllersLoader *this,ParserString *data,size_t length)

{
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_t *psVar1;
  bool bVar2;
  value_type local_50;
  
  if (this->mJointSidsOrIds != (StringList *)0x0) {
    psVar1 = &(data->super_UnionString).length;
    while (bVar2 = length != 0, length = length - 1, bVar2) {
      this_00 = this->mJointSidsOrIds;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,((UnionString *)(psVar1 + -1))->str,
                 ((UnionString *)(psVar1 + -1))->str + *psVar1);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      psVar1 = psVar1 + 2;
    }
  }
  return true;
}

Assistant:

bool LibraryControllersLoader::dataJointArray( const ParserString* data, size_t length )
	{
		if ( !mJointSidsOrIds )
			return true;

		for ( size_t i = 0; i < length;  ++i)
		{
			const ParserString& parserString = data[i];
			mJointSidsOrIds->push_back( String( parserString.str, parserString.length ) );
		}
		return true;
	}